

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O3

EmitInfo __thiscall
JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
          (Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer> *this)

{
  Type *pTVar1;
  EmitInfo EVar2;
  
  pTVar1 = List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(&this->list,
                  (this->list).
                  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count
                  + -1);
  Js::
  CopyRemovePolicy<JsUtil::List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  ::RemoveAt((CopyRemovePolicy<JsUtil::List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
              *)&(this->list).field_0x28,&this->list,
             (this->list).
             super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count + -1)
  ;
  EVar2.super_EmitInfoBase.location = (pTVar1->super_EmitInfoBase).location;
  EVar2.type = pTVar1->type;
  return EVar2;
}

Assistant:

T Pop()
        {
            T item = list.Item(list.Count() - 1);
            list.RemoveAt(list.Count() - 1);
            return item;
        }